

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase229::run(TestCase229 *this)

{
  byte *pbVar1;
  Builder reader;
  Builder reader_00;
  Reader reader_01;
  Reader reader_02;
  Reader reader_03;
  Builder builder_00;
  SegmentBuilder *pSVar2;
  CapTableBuilder *pCVar3;
  CapTableBuilder *pCVar4;
  void *pvVar5;
  WirePointer *pWVar6;
  undefined8 uVar7;
  Disposer *pDVar8;
  long *plVar9;
  PointerType PVar10;
  SegmentBuilder *__n;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *__buf;
  int in_R8D;
  initializer_list<int> expected;
  initializer_list<int> expected_00;
  initializer_list<int> expected_01;
  Own<capnp::ClientHook> OVar11;
  Builder root;
  Builder anyList;
  EventLoop loop;
  Builder anyStruct;
  int callCount;
  WaitScope waitScope;
  MallocMessageBuilder builder;
  StructBuilder local_2a8;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  local_280;
  undefined1 local_248 [16];
  Event *local_238;
  WirePointer *pWStack_230;
  Event **local_228;
  Disposer *pDStack_220;
  OrphanBuilder local_208;
  ListBuilder local_1e8;
  Disposer *in_stack_fffffffffffffe40;
  RequestHook *in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe54;
  int iVar12;
  SegmentBuilder *in_stack_fffffffffffffe58;
  EventLoop *this_00;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  StructBuilder local_190;
  Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_> local_168 [3];
  undefined8 *local_138;
  long *local_130;
  Maybe<capnp::MessageSize> local_128;
  MallocMessageBuilder local_110;
  
  MallocMessageBuilder::MallocMessageBuilder(&local_110,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRootInternal((Builder *)&local_1e8,&local_110.super_MessageBuilder);
  local_238 = (Event *)local_1e8.ptr;
  local_248._0_8_ = local_1e8.segment;
  local_248._8_8_ = local_1e8.capTable;
  PointerBuilder::getStruct(&local_2a8,(PointerBuilder *)local_248,(StructSize)0x30000,(word *)0x0);
  local_248._0_8_ = local_2a8.segment;
  local_248._8_8_ = local_2a8.capTable;
  local_238 = (Event *)local_2a8.pointers;
  PointerBuilder::initStruct(&local_190,(PointerBuilder *)local_248,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffe48;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffe40;
  builder_00._builder.data._0_4_ = in_stack_fffffffffffffe50;
  builder_00._builder.data._4_4_ = in_stack_fffffffffffffe54;
  builder_00._builder.pointers = (WirePointer *)in_stack_fffffffffffffe58;
  builder_00._builder.dataSize = in_stack_fffffffffffffe60;
  builder_00._builder._36_4_ = in_stack_fffffffffffffe64;
  initTestMessage(builder_00);
  local_248._0_8_ = local_2a8.segment;
  local_248._8_8_ = local_2a8.capTable;
  local_238 = (Event *)local_2a8.pointers;
  PointerBuilder::getStruct
            ((StructBuilder *)&local_1e8,(PointerBuilder *)local_248,(StructSize)0x0,(word *)0x0);
  checkTestMessage((Builder)builder.super_MessageBuilder.arenaSpace._112_40_);
  StructBuilder::asReader((StructBuilder *)&local_1e8);
  reader_01._reader.capTable = (CapTableReader *)local_248._8_8_;
  reader_01._reader.segment = (SegmentReader *)local_248._0_8_;
  reader_01._reader.data = local_238;
  reader_01._reader.pointers = pWStack_230;
  reader_01._reader._32_8_ = local_228;
  reader_01._reader._40_8_ = pDStack_220;
  checkTestMessage(reader_01);
  local_248._0_8_ = local_2a8.segment;
  local_248._8_8_ = local_2a8.capTable;
  local_238 = (Event *)local_2a8.pointers;
  PVar10 = PointerBuilder::getPointerType((PointerBuilder *)local_248);
  if ((PVar10 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    in_R8D = 0x2bd73d;
    kj::_::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xef,ERROR,"\"failed: expected \" \"root.hasAnyStructField()\"",
               (char (*) [42])"failed: expected root.hasAnyStructField()");
  }
  local_208.tag.content = (uint64_t)local_2a8.segment;
  local_208.segment = (SegmentBuilder *)local_2a8.capTable;
  local_208.capTable = (CapTableBuilder *)local_2a8.pointers;
  PointerBuilder::disown((OrphanBuilder *)local_248,(PointerBuilder *)&local_208);
  local_280.super_Builder._builder.capTable = (CapTableBuilder *)local_248._8_8_;
  local_280.super_Builder._builder.data = local_238;
  local_280.super_Builder._builder.pointers = pWStack_230;
  local_280.super_Builder._builder.segment = (SegmentBuilder *)local_248._0_8_;
  OrphanBuilder::asStructReader
            ((StructReader *)local_248,(OrphanBuilder *)&local_280,(StructSize)0x0);
  reader_02._reader.capTable = (CapTableReader *)local_248._8_8_;
  reader_02._reader.segment = (SegmentReader *)local_248._0_8_;
  reader_02._reader.data = local_238;
  reader_02._reader.pointers = pWStack_230;
  reader_02._reader._32_8_ = local_228;
  reader_02._reader._40_8_ = pDStack_220;
  checkTestMessage(reader_02);
  local_248._0_8_ = local_2a8.segment;
  local_248._8_8_ = local_2a8.capTable;
  local_238 = (Event *)local_2a8.pointers;
  PVar10 = PointerBuilder::getPointerType((PointerBuilder *)local_248);
  if ((PVar10 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    in_R8D = 0x2bd799;
    kj::_::Debug::log<char_const(&)[45]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xf2,ERROR,"\"failed: expected \" \"!(root.hasAnyStructField())\"",
               (char (*) [45])"failed: expected !(root.hasAnyStructField())");
  }
  local_248._0_8_ = local_2a8.segment;
  local_248._8_8_ = local_2a8.capTable;
  local_238 = (Event *)local_2a8.pointers;
  PointerBuilder::adopt((PointerBuilder *)local_248,(OrphanBuilder *)&local_280);
  local_248._0_8_ = local_2a8.segment;
  local_248._8_8_ = local_2a8.capTable;
  local_238 = (Event *)local_2a8.pointers;
  PVar10 = PointerBuilder::getPointerType((PointerBuilder *)local_248);
  if ((PVar10 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    in_R8D = 0x2bd73d;
    kj::_::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
               ,0xf5,ERROR,"\"failed: expected \" \"root.hasAnyStructField()\"",
               (char (*) [42])"failed: expected root.hasAnyStructField()");
  }
  local_208.tag.content = (uint64_t)local_2a8.segment;
  local_208.segment = (SegmentBuilder *)local_2a8.capTable;
  local_208.capTable = (CapTableBuilder *)local_2a8.pointers;
  PointerBuilder::getStruct
            ((StructBuilder *)local_248,(PointerBuilder *)&local_208,(StructSize)0x0,(word *)0x0);
  checkTestMessage((Builder)builder.super_MessageBuilder.arenaSpace._112_40_);
  if ((SegmentBuilder *)local_280.super_Builder._builder.capTable != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize((OrphanBuilder *)&local_280);
  }
  local_238 = (Event *)((long)local_2a8.pointers + 8);
  local_248._0_8_ = local_2a8.segment;
  local_248._8_8_ = local_2a8.capTable;
  PointerBuilder::initList(&local_1e8,(PointerBuilder *)local_248,FOUR_BYTES,3);
  ((WireValue<uint32_t> *)local_1e8.ptr)->value = 0x7b;
  pbVar1 = (byte *)((long)&((WireValue<uint32_t> *)local_1e8.ptr)->value +
                   (ulong)(local_1e8.step >> 3));
  pbVar1[0] = 200;
  pbVar1[1] = '\x01';
  pbVar1[2] = '\0';
  pbVar1[3] = '\0';
  pbVar1 = (byte *)((long)&((WireValue<uint32_t> *)local_1e8.ptr)->value +
                   (ulong)(local_1e8.step >> 2));
  pbVar1[0] = '\x15';
  pbVar1[1] = '\x03';
  pbVar1[2] = '\0';
  pbVar1[3] = '\0';
  local_238 = (Event *)((long)local_2a8.pointers + 8);
  local_248._0_8_ = local_2a8.segment;
  local_248._8_8_ = local_2a8.capTable;
  PointerBuilder::getListAnySize((ListBuilder *)&local_280,(PointerBuilder *)local_248,(word *)0x0);
  local_248._0_8_ = (SegmentBuilder *)0x1c80000007b;
  local_248._8_4_ = 0x315;
  reader.builder.capTable = local_280.super_Builder._builder.capTable;
  reader.builder.segment = local_280.super_Builder._builder.segment;
  reader.builder.ptr = (byte *)local_280.super_Builder._builder.data;
  reader.builder._24_8_ = local_280.super_Builder._builder.pointers;
  reader.builder.structDataSize = local_280.super_Builder._builder.dataSize;
  reader.builder.structPointerCount = local_280.super_Builder._builder.pointerCount;
  reader.builder.elementSize = local_280.super_Builder._builder._38_1_;
  reader.builder._39_1_ = local_280.super_Builder._builder._39_1_;
  expected._M_len = 3;
  expected._M_array = (iterator)local_248;
  checkList<capnp::List<int,_(capnp::Kind)0>::Builder,_capnp::List<int,_(capnp::Kind)0>,_false>
            (reader,expected);
  local_238 = (Event *)((long)local_2a8.pointers + 8);
  local_248._0_8_ = local_2a8.segment;
  local_248._8_8_ = local_2a8.capTable;
  PVar10 = PointerBuilder::getPointerType((PointerBuilder *)local_248);
  if ((PVar10 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    in_R8D = 0x2bd7f3;
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x102,ERROR,"\"failed: expected \" \"root.hasAnyListField()\"",
               (char (*) [40])"failed: expected root.hasAnyListField()");
  }
  PointerBuilder::disown((OrphanBuilder *)local_248,(PointerBuilder *)&stack0xfffffffffffffe58);
  local_208.segment = (SegmentBuilder *)local_248._8_8_;
  local_208.capTable = (CapTableBuilder *)local_238;
  local_208.location = (word *)pWStack_230;
  local_208.tag.content = local_248._0_8_;
  OrphanBuilder::asListReaderAnySize((ListReader *)local_248,&local_208);
  reader_03.reader.capTable = (CapTableReader *)local_248._8_8_;
  reader_03.reader.segment = (SegmentReader *)local_248._0_8_;
  reader_03.reader.ptr = (byte *)local_238;
  reader_03.reader._24_8_ = pWStack_230;
  reader_03.reader._32_8_ = local_228;
  reader_03.reader._40_8_ = pDStack_220;
  expected_00._M_len = 3;
  expected_00._M_array = (iterator)&stack0xfffffffffffffe58;
  checkList<capnp::List<int,_(capnp::Kind)0>::Reader,_capnp::List<int,_(capnp::Kind)0>_>
            (reader_03,expected_00);
  local_238 = (Event *)((long)local_2a8.pointers + 8);
  local_248._0_8_ = local_2a8.segment;
  local_248._8_8_ = local_2a8.capTable;
  PVar10 = PointerBuilder::getPointerType((PointerBuilder *)local_248);
  if ((PVar10 != NULL_) && (kj::_::Debug::minSeverity < 3)) {
    in_R8D = 0x2bd84b;
    kj::_::Debug::log<char_const(&)[43]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x105,ERROR,"\"failed: expected \" \"!(root.hasAnyListField())\"",
               (char (*) [43])"failed: expected !(root.hasAnyListField())");
  }
  local_238 = (Event *)((long)local_2a8.pointers + 8);
  local_248._0_8_ = local_2a8.segment;
  local_248._8_8_ = local_2a8.capTable;
  PointerBuilder::adopt((PointerBuilder *)local_248,&local_208);
  local_238 = (Event *)((long)local_2a8.pointers + 8);
  local_248._0_8_ = local_2a8.segment;
  local_248._8_8_ = local_2a8.capTable;
  PVar10 = PointerBuilder::getPointerType((PointerBuilder *)local_248);
  if ((PVar10 == NULL_) && (kj::_::Debug::minSeverity < 3)) {
    in_R8D = 0x2bd7f3;
    kj::_::Debug::log<char_const(&)[40]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x108,ERROR,"\"failed: expected \" \"root.hasAnyListField()\"",
               (char (*) [40])"failed: expected root.hasAnyListField()");
  }
  PointerBuilder::getListAnySize
            ((ListBuilder *)local_248,(PointerBuilder *)&stack0xfffffffffffffe58,(word *)0x0);
  reader_00.builder.capTable = (CapTableBuilder *)local_248._8_8_;
  reader_00.builder.segment = (SegmentBuilder *)local_248._0_8_;
  reader_00.builder.ptr = (byte *)local_238;
  reader_00.builder._24_8_ = pWStack_230;
  reader_00.builder._32_8_ = local_228;
  expected_01._M_len = 3;
  expected_01._M_array = (iterator)&stack0xfffffffffffffe58;
  checkList<capnp::List<int,_(capnp::Kind)0>::Builder,_capnp::List<int,_(capnp::Kind)0>,_false>
            (reader_00,expected_01);
  if (local_208.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_208);
  }
  this_00 = (EventLoop *)local_248;
  kj::EventLoop::EventLoop(this_00);
  kj::EventLoop::enterScope(this_00);
  iVar12 = 0;
  kj::heap<capnp::_::TestInterfaceImpl,int&>((kj *)&local_208,(int *)&stack0xfffffffffffffe54);
  __n = local_208.segment;
  local_1e8.segment = (SegmentBuilder *)local_208.tag.content;
  local_1e8.capTable = (CapTableBuilder *)&((local_208.segment)->super_SegmentReader).ptr;
  if (local_208.segment == (SegmentBuilder *)0x0) {
    local_1e8.capTable = (CapTableBuilder *)0x0;
  }
  local_208.segment = (SegmentBuilder *)0x0;
  OVar11 = Capability::Client::makeLocalClient
                     ((Client *)&local_280,(Own<capnp::Capability::Server> *)&local_1e8);
  pCVar3 = local_1e8.capTable;
  if ((ArrayPtr<const_capnp::word> *)local_1e8.capTable != (ArrayPtr<const_capnp::word> *)0x0) {
    local_1e8.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_1e8.segment)->super_SegmentReader).arena)->_vptr_Arena)
              (local_1e8.segment,
               (pCVar3->super_CapTableReader)._vptr_CapTableReader[-2] +
               (long)&(pCVar3->super_CapTableReader)._vptr_CapTableReader,OVar11.ptr);
  }
  local_1e8.ptr = (byte *)((long)local_2a8.pointers + 0x10);
  local_1e8.segment = local_2a8.segment;
  local_1e8.capTable = local_2a8.capTable;
  PointerBuilder::setCapability((PointerBuilder *)&local_1e8,(Own<capnp::ClientHook> *)&local_280);
  pCVar3 = local_280.super_Builder._builder.capTable;
  if ((SegmentBuilder *)local_280.super_Builder._builder.capTable != (SegmentBuilder *)0x0) {
    local_280.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (*(code *)(((local_280.super_Builder._builder.segment)->super_SegmentReader).arena)->_vptr_Arena
    )(local_280.super_Builder._builder.segment,
      (_func_int *)
      ((long)((SegmentReader *)&pCVar3->super_CapTableReader)->arena[-2]._vptr_Arena +
      (long)&pCVar3->super_CapTableReader));
  }
  pSVar2 = local_208.segment;
  if (local_208.segment != (SegmentBuilder *)0x0) {
    local_208.segment = (SegmentBuilder *)0x0;
    (*(code *)**(undefined8 **)local_208.tag.content)
              (local_208.tag.content,
               (long)&(pSVar2->super_SegmentReader).arena +
               (long)(pSVar2->super_SegmentReader).arena[-2]._vptr_Arena);
  }
  local_1e8.ptr = (byte *)((long)local_2a8.pointers + 0x10);
  local_1e8.segment = local_2a8.segment;
  local_1e8.capTable = local_2a8.capTable;
  OVar11 = PointerBuilder::getCapability((PointerBuilder *)&local_280);
  pCVar3 = local_280.super_Builder._builder.capTable;
  pSVar2 = local_280.super_Builder._builder.segment;
  (*(code *)((SegmentReader *)&(local_280.super_Builder._builder.capTable)->super_CapTableReader)->
            arena[4]._vptr_Arena)(&local_208,local_280.super_Builder._builder.capTable,OVar11.ptr);
  local_280.super_Builder._builder.capTable = (CapTableBuilder *)local_208.tag.content;
  local_280.super_Builder._builder.data = local_208.segment;
  local_280.super_Builder._builder.segment = (SegmentBuilder *)&Capability::Client::typeinfo;
  local_128.ptr.isSet = false;
  capnproto_test::capnp::test::TestInterface::Client::fooRequest
            ((Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
              *)&local_1e8,(Client *)&local_280,&local_128);
  pvVar5 = local_280.super_Builder._builder.data;
  __buf = extraout_RDX;
  if ((SegmentBuilder *)local_280.super_Builder._builder.data != (SegmentBuilder *)0x0) {
    local_280.super_Builder._builder.data = (SegmentBuilder *)0x0;
    (*(code *)((SegmentReader *)&(local_280.super_Builder._builder.capTable)->super_CapTableReader)
              ->arena->_vptr_Arena)
              (local_280.super_Builder._builder.capTable,
               (long)&((SegmentReader *)pvVar5)->arena +
               (long)((SegmentReader *)pvVar5)->arena[-2]._vptr_Arena);
    __buf = extraout_RDX_00;
  }
  local_1e8.ptr[0] = '{';
  local_1e8.ptr[1] = '\0';
  local_1e8.ptr[2] = '\0';
  local_1e8.ptr[3] = '\0';
  *(byte *)((long)local_1e8.ptr + 4) = *(byte *)((long)local_1e8.ptr + 4) | 1;
  Request<capnproto_test::capnp::test::TestInterface::FooParams,_capnproto_test::capnp::test::TestInterface::FooResults>
  ::send(&local_280,(int)&local_1e8,__buf,(size_t)__n,in_R8D);
  kj::Promise<capnp::Response<capnproto_test::capnp::test::TestInterface::FooResults>_>::wait
            (local_168,&local_280);
  plVar9 = local_130;
  if (local_130 != (long *)0x0) {
    local_130 = (long *)0x0;
    (**(code **)*local_138)(local_138,(long)plVar9 + *(long *)(*plVar9 + -0x10));
  }
  pDVar8 = local_280.hook.disposer;
  uVar7 = local_280.super_Builder._builder._32_8_;
  if (local_280.super_Builder._builder._32_8_ != 0) {
    local_280.super_Builder._builder.dataSize = 0;
    local_280.super_Builder._builder.pointerCount = 0;
    local_280.super_Builder._builder._38_2_ = 0;
    local_280.hook.disposer = (Disposer *)0x0;
    (**(local_280.hook.ptr)->_vptr_RequestHook)(local_280.hook.ptr,uVar7,8,pDVar8,pDVar8,0);
  }
  pWVar6 = local_280.super_Builder._builder.pointers;
  if (local_280.super_Builder._builder.pointers != (WirePointer *)0x0) {
    local_280.super_Builder._builder.pointers = (WirePointer *)0x0;
    (*(code *)((SegmentReader *)local_280.super_Builder._builder.data)->arena->_vptr_Arena)
              (local_280.super_Builder._builder.data,
               (long)&(pWVar6->offsetAndKind).value + *(long *)((long)*pWVar6 - 0x10));
  }
  pCVar4 = local_280.super_Builder._builder.capTable;
  if ((SegmentBuilder *)local_280.super_Builder._builder.capTable != (SegmentBuilder *)0x0) {
    local_280.super_Builder._builder.capTable = (CapTableBuilder *)0x0;
    (**(code **)((local_280.super_Builder._builder.segment)->super_SegmentReader).arena)
              (local_280.super_Builder._builder.segment,
               (long)&((SegmentReader *)&pCVar4->super_CapTableReader)->arena +
               (long)((SegmentReader *)&pCVar4->super_CapTableReader)->arena[-2]._vptr_Arena);
  }
  if ((iVar12 != 1) && (kj::_::Debug::minSeverity < 3)) {
    local_280.super_Builder._builder.segment =
         (SegmentBuilder *)CONCAT44(local_280.super_Builder._builder.segment._4_4_,1);
    kj::_::Debug::log<char_const(&)[36],int,int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/any-test.c++"
               ,0x118,ERROR,"\"failed: expected \" \"(1) == (callCount)\", 1, callCount",
               (char (*) [36])"failed: expected (1) == (callCount)",(int *)&local_280,
               (int *)&stack0xfffffffffffffe54);
  }
  if (in_stack_fffffffffffffe48 != (RequestHook *)0x0) {
    (**in_stack_fffffffffffffe40->_vptr_Disposer)
              (in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe48->_vptr_RequestHook[-2] +
               (long)&in_stack_fffffffffffffe48->_vptr_RequestHook);
  }
  (*(code *)((pSVar2->super_SegmentReader).arena)->_vptr_Arena)
            (pSVar2,(_func_int *)
                    ((long)((SegmentReader *)&pCVar3->super_CapTableReader)->arena[-2]._vptr_Arena +
                    (long)&pCVar3->super_CapTableReader));
  kj::EventLoop::leaveScope(this_00);
  kj::EventLoop::~EventLoop((EventLoop *)local_248);
  MallocMessageBuilder::~MallocMessageBuilder(&local_110);
  return;
}

Assistant:

TEST(Any, AnyStructListCapInSchema) {
  MallocMessageBuilder builder;
  auto root = builder.getRoot<test::TestAnyOthers>();

  {
    initTestMessage(root.initAnyStructFieldAs<TestAllTypes>());
    AnyStruct::Builder anyStruct = root.getAnyStructField();
    checkTestMessage(anyStruct.as<TestAllTypes>());
    checkTestMessage(anyStruct.asReader().as<TestAllTypes>());

    EXPECT_TRUE(root.hasAnyStructField());
    auto orphan = root.disownAnyStructField();
    checkTestMessage(orphan.getReader().as<TestAllTypes>());
    EXPECT_FALSE(root.hasAnyStructField());

    root.adoptAnyStructField(kj::mv(orphan));
    EXPECT_TRUE(root.hasAnyStructField());
    checkTestMessage(root.getAnyStructField().as<TestAllTypes>());
  }

  {
    List<int>::Builder list = root.initAnyListFieldAs<List<int>>(3);
    list.set(0, 123);
    list.set(1, 456);
    list.set(2, 789);

    AnyList::Builder anyList = root.getAnyListField();
    checkList(anyList.as<List<int>>(), {123, 456, 789});

    EXPECT_TRUE(root.hasAnyListField());
    auto orphan = root.disownAnyListField();
    checkList(orphan.getReader().as<List<int>>(), {123, 456, 789});
    EXPECT_FALSE(root.hasAnyListField());

    root.adoptAnyListField(kj::mv(orphan));
    EXPECT_TRUE(root.hasAnyListField());
    checkList(root.getAnyListField().as<List<int>>(), {123, 456, 789});
  }

#if !CAPNP_LITE
  // This portion of the test relies on a Client, not present in lite-mode.
  {
    kj::EventLoop loop;
    kj::WaitScope waitScope(loop);
    int callCount = 0;
    root.setCapabilityField(kj::heap<TestInterfaceImpl>(callCount));
    Capability::Client client = root.getCapabilityField();
    auto req = client.castAs<test::TestInterface>().fooRequest();
    req.setI(123);
    req.setJ(true);
    req.send().wait(waitScope);
    EXPECT_EQ(1, callCount);
  }
#endif
}